

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::find<long>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
             *this,key_arg<long> *key)

{
  bool bVar1;
  ulong uVar2;
  iterator iVar3;
  
  AssertNotDebugCapacity(this);
  bVar1 = is_soo(this);
  if (bVar1) {
    iVar3 = find_soo<long>(this,key);
    return iVar3;
  }
  prefetch_heap_block(this);
  uVar2 = (*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
  iVar3 = find_non_soo<long>(this,key,uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                                      (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8
                                      | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                                      (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  return iVar3;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }